

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::InnerProductParameter::Clear(InnerProductParameter *this)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogFinisher local_da;
  byte local_d9;
  LogMessage local_d8;
  LogFinisher local_9d [20];
  byte local_89;
  LogMessage local_88;
  InnerProductParameter *local_50;
  InnerProductParameter *this_local;
  InternalMetadataWithArena *local_40;
  InternalMetadataWithArena *local_38;
  undefined4 local_2c;
  HasBits<1UL> *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_18 = &this->_has_bits_;
  local_1c = 0;
  local_50 = this;
  if ((local_18->has_bits_[0] & 3) != 0) {
    bVar1 = has_weight_filler(this);
    if (bVar1) {
      local_89 = 0;
      if (this->weight_filler_ == (FillerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x7365);
        local_89 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_88,"CHECK failed: weight_filler_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(local_9d,pLVar2);
      }
      if ((local_89 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_88);
      }
      FillerParameter::Clear(this->weight_filler_);
    }
    bVar1 = has_bias_filler(this);
    if (bVar1) {
      local_d9 = 0;
      if (this->bias_filler_ == (FillerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x7369);
        local_d9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_d8,"CHECK failed: bias_filler_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_da,pLVar2);
      }
      if ((local_d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
      }
      FillerParameter::Clear(this->bias_filler_);
    }
  }
  local_28 = &this->_has_bits_;
  local_2c = 0;
  if ((local_28->has_bits_[0] & 0x3c) != 0) {
    memset(&this->num_output_,0,5);
    this->bias_term_ = true;
    this->axis_ = 1;
  }
  this_local = (InnerProductParameter *)&this->_has_bits_;
  memset(this_local,0,4);
  local_40 = &this->_internal_metadata_;
  if (((uint)(local_40->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_38 = local_40;
    local_10 = local_40;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_40);
  }
  return;
}

Assistant:

void InnerProductParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.InnerProductParameter)
  if (_has_bits_[0 / 32] & 3u) {
    if (has_weight_filler()) {
      GOOGLE_DCHECK(weight_filler_ != NULL);
      weight_filler_->::caffe::FillerParameter::Clear();
    }
    if (has_bias_filler()) {
      GOOGLE_DCHECK(bias_filler_ != NULL);
      bias_filler_->::caffe::FillerParameter::Clear();
    }
  }
  if (_has_bits_[0 / 32] & 60u) {
    ::memset(&num_output_, 0, reinterpret_cast<char*>(&transpose_) -
      reinterpret_cast<char*>(&num_output_) + sizeof(transpose_));
    bias_term_ = true;
    axis_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}